

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O2

void __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::printfree(WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
            *this)

{
  type pFVar1;
  double local_40;
  uint local_34;
  
  printf("#%10s%30s\n","State","DimensionlessFreeEnergy");
  for (local_34 = 0;
      (ulong)local_34 <
      (ulong)((long)(this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); local_34 = local_34 + 1) {
    std::operator<<((ostream *)&std::cout,"#");
    fcout.w = 10;
    FormatStream<std::ostream>::operator<<((FormatStream<std::ostream> *)&fcout,&local_34);
    fcout.w = 0x1e;
    fcout.prec = 0xf;
    local_40 = log((this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_34]);
    pFVar1 = FormatStream<std::ostream>::operator<<((FormatStream<std::ostream> *)&fcout,&local_40);
    std::endl<char,std::char_traits<char>>((ostream *)pFVar1->stream);
  }
  return;
}

Assistant:

void WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::printfree() const {
  printf("#%10s%30s\n","State","DimensionlessFreeEnergy");
  for(uint i = 0; i < expf.size(); ++i) {
    cout << "#";
    fcout.width(10);
    fcout << i;
    fcout.width(30);
    fcout.precision(15);
    fcout << log(expf[i]) << endl;
  }
}